

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5fce8::CtorEvalExternalInterface::tableStore
          (CtorEvalExternalInterface *this,Name tableName,Address index,Literal *value)

{
  string *this_00;
  string local_48 [39];
  allocator<char> local_21;
  
  if (this->instanceInitialized != true) {
    return;
  }
  this_00 = (string *)
            __cxa_allocate_exception
                      (0x20,tableName.super_IString.str._M_len,tableName.super_IString.str._M_str);
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"tableStore after init: TODO",&local_21);
  std::__cxx11::string::string(this_00,local_48);
  __cxa_throw(this_00,&(anonymous_namespace)::FailToEvalException::typeinfo,
              FailToEvalException::~FailToEvalException);
}

Assistant:

void
  tableStore(Name tableName, Address index, const Literal& value) override {
    // We allow stores to the table during initialization, but not after, as we
    // assume the table does not change at runtime.
    // TODO: Allow table changes by updating the table later like we do with the
    //       memory, by tracking and serializing them.
    if (instanceInitialized) {
      throw FailToEvalException("tableStore after init: TODO");
    }
  }